

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O3

string * __thiscall
libtorrent::combine_path_abi_cxx11_
          (string *__return_storage_ptr__,libtorrent *this,string_view lhs,string_view rhs)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  size_type __rlen;
  size_type __rlen_1;
  libtorrent *plVar7;
  
  pcVar5 = (char *)rhs._M_len;
  pcVar3 = lhs._M_str;
  pcVar4 = (char *)lhs._M_len;
  if ((this == (libtorrent *)0x0) || ((this == (libtorrent *)0x1 && (*pcVar4 == '.')))) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    plVar7 = (libtorrent *)(pcVar3 + (long)pcVar5);
    pcVar4 = pcVar5;
  }
  else {
    if ((pcVar3 != (char *)0x0) && ((pcVar3 != (char *)0x1 || (*pcVar5 != '.')))) {
      cVar1 = (pcVar4 + -1)[(long)this];
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
      ::std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)(this + 2 + (long)pcVar3));
      pcVar6 = "/";
      if (cVar1 == '/') {
        pcVar6 = "";
      }
      iVar2 = snprintf((__return_storage_ptr__->_M_dataplus)._M_p,(size_t)(this + 2 + (long)pcVar3),
                       "%*s%s%*s",(ulong)this & 0xffffffff,pcVar4,pcVar6,pcVar3,pcVar5);
      ::std::__cxx11::string::resize((ulong)__return_storage_ptr__,(char)iVar2);
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    plVar7 = this + (long)pcVar4;
  }
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar4,plVar7,pcVar3,pcVar5,rhs._M_str);
  return __return_storage_ptr__;
}

Assistant:

std::string combine_path(string_view lhs, string_view rhs)
	{
		TORRENT_ASSERT(!is_complete(rhs));
		if (lhs.empty() || lhs == ".") return std::string(rhs);
		if (rhs.empty() || rhs == ".") return std::string(lhs);

#if defined(TORRENT_WINDOWS) || defined(TORRENT_OS2)
#define TORRENT_SEPARATOR "\\"
		bool const need_sep = lhs[lhs.size() - 1] != '\\' && lhs[lhs.size() - 1] != '/';
#else
#define TORRENT_SEPARATOR "/"
		bool const need_sep = lhs[lhs.size() - 1] != '/';
#endif
		std::string ret;
		std::size_t target_size = lhs.size() + rhs.size() + 2;
		ret.resize(target_size);
		target_size = aux::numeric_cast<std::size_t>(std::snprintf(&ret[0], target_size, "%*s%s%*s"
			, int(lhs.size()), lhs.data()
			, (need_sep ? TORRENT_SEPARATOR : "")
			, int(rhs.size()), rhs.data()));
		ret.resize(target_size);
		return ret;
	}